

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::create_pipeline
          (DeconvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  Option *in_stack_00000050;
  DeconvolutionDepthWise_x86_avx512 *in_stack_00000058;
  Mat weight_data_r2_2;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int elempack;
  int channels;
  int maxk;
  Allocator *in_stack_fffffffffffffc68;
  size_t in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  Mat *in_stack_fffffffffffffc80;
  Option *in_stack_fffffffffffffc88;
  void **ppvVar5;
  int in_stack_fffffffffffffc94;
  Mat *in_stack_fffffffffffffc98;
  Mat *in_stack_fffffffffffffca0;
  int local_31c;
  int local_318;
  Allocator *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  Mat *in_stack_fffffffffffffd08;
  long *local_2e8;
  void *local_2c0;
  int *local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  long *local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined8 local_280;
  void *local_278;
  int *local_270;
  undefined8 local_268;
  undefined4 local_260;
  long *local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined8 local_238;
  int local_230;
  int local_22c;
  long local_228;
  void *local_210;
  void *local_208;
  int *local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  long *local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined8 local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  byte *local_1b0;
  int local_19c;
  undefined8 local_198;
  undefined8 local_190;
  undefined4 local_184;
  void **local_180;
  void **local_178;
  long *local_170;
  void **local_168;
  void **local_158;
  undefined8 *local_148;
  void **local_138;
  int local_128;
  undefined4 local_124;
  void **local_120;
  void **local_118;
  void **local_110;
  int local_108;
  undefined4 local_104;
  void **local_100;
  int local_e8;
  undefined4 local_e4;
  void **local_e0;
  int local_c8;
  undefined4 local_c4;
  undefined8 *local_c0;
  int local_a8;
  undefined4 local_a4;
  void **local_a0;
  int local_88;
  undefined4 local_84;
  void **local_80;
  int local_78;
  undefined4 local_74;
  undefined8 *local_70;
  int local_68;
  undefined4 local_64;
  undefined8 *local_60;
  void *local_58;
  void *local_50;
  void *local_18;
  void *local_8;
  
  if (*(int *)(in_RDI + 0x168) == 0) {
    local_1b4 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
    uVar2 = (long)*(int *)(in_RDI + 0x110) / (long)*(int *)(in_RDI + 0x114);
    local_1b8 = ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                      (long)local_1b4) / (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114))) *
                *(int *)(in_RDI + 0x114);
    local_1b0 = in_RSI;
    if ((local_1b8 == *(int *)(in_RDI + 0x114)) &&
       (*(int *)(in_RDI + 0x114) == *(int *)(in_RDI + 0xd0))) {
      local_1bc = 1;
      if ((in_RSI[0x27] & 1) != 0) {
        if (local_1b8 % 0x10 == 0) {
          local_318 = 0x10;
        }
        else {
          if (local_1b8 % 8 == 0) {
            local_31c = 8;
          }
          else {
            local_31c = 1;
            if (local_1b8 % 4 == 0) {
              local_31c = 4;
            }
          }
          local_318 = local_31c;
        }
        local_1bc = local_318;
      }
      local_184 = *(undefined4 *)(in_RDI + 0x19c);
      local_180 = &local_208;
      local_190 = 4;
      local_198 = 0;
      local_208 = (void *)0x0;
      local_200 = (int *)0x0;
      local_1f8 = 0;
      local_1f0 = 0;
      local_1e8 = (long *)0x0;
      local_1e0 = 0;
      local_1dc = 0;
      local_1d8 = 0;
      local_1d4 = 0;
      local_1d0 = 0;
      local_1c8 = 0;
      Mat::create(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                  in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      local_178 = &local_208;
      local_210 = local_208;
      local_170 = (long *)(in_RDI + 0x170);
      local_228 = *local_170;
      for (local_22c = 0;
          local_22c <
          (local_1b8 / *(int *)(in_RDI + 0x114)) *
          (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x114)) * *(int *)(in_RDI + 0x114);
          local_22c = local_22c + 1) {
        for (local_230 = 0; local_230 < local_1b4; local_230 = local_230 + 1) {
          *(undefined4 *)((long)local_210 + (long)((local_1b4 + -1) - local_230) * 4) =
               *(undefined4 *)(local_228 + (long)local_230 * 4);
        }
        local_228 = local_228 + (long)local_1b4 * 4;
        local_210 = (void *)((long)local_210 + (long)local_1b4 * 4);
      }
      if (local_1bc == 0x10) {
        Mat::reshape(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8);
        convert_packing(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
        local_168 = &local_278;
        local_80 = local_168;
        if (local_270 != (int *)0x0) {
          local_84 = 0xffffffff;
          LOCK();
          local_88 = *local_270;
          *local_270 = *local_270 + -1;
          UNLOCK();
          if (local_88 == 1) {
            if (local_258 == (long *)0x0) {
              if (local_278 != (void *)0x0) {
                free(local_278);
              }
            }
            else {
              (**(code **)(*local_258 + 0x18))(local_258,local_278);
            }
          }
        }
        local_278 = (void *)0x0;
        local_268 = 0;
        local_260 = 0;
        local_250 = 0;
        local_24c = 0;
        local_248 = 0;
        local_244 = 0;
        local_240 = 0;
        local_238 = 0;
        local_270 = (int *)0x0;
      }
      if (local_1bc == 8) {
        Mat::reshape(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8);
        convert_packing(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
        local_158 = &local_2c0;
        local_a0 = local_158;
        if (local_2b8 != (int *)0x0) {
          local_a4 = 0xffffffff;
          LOCK();
          local_a8 = *local_2b8;
          *local_2b8 = *local_2b8 + -1;
          UNLOCK();
          if (local_a8 == 1) {
            if (local_2a0 == (long *)0x0) {
              if (local_2c0 != (void *)0x0) {
                free(local_2c0);
              }
            }
            else {
              (**(code **)(*local_2a0 + 0x18))(local_2a0,local_2c0);
            }
          }
        }
        local_2c0 = (void *)0x0;
        local_2b0 = 0;
        local_2a8 = 0;
        local_298 = 0;
        local_294 = 0;
        local_290 = 0;
        local_28c = 0;
        local_288 = 0;
        local_280 = 0;
        local_2b8 = (int *)0x0;
      }
      if (local_1bc == 4) {
        Mat::reshape(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8);
        convert_packing(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc94,in_stack_fffffffffffffc88);
        puVar4 = (undefined8 *)&stack0xfffffffffffffcf8;
        local_148 = puVar4;
        local_c0 = puVar4;
        if (CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00) != 0) {
          piVar1 = (int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00);
          local_c4 = 0xffffffff;
          LOCK();
          local_c8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_c8 == 1) {
            if (local_2e8 == (long *)0x0) {
              if (in_stack_fffffffffffffcf8 != (Allocator *)0x0) {
                free(in_stack_fffffffffffffcf8);
              }
            }
            else {
              (**(code **)(*local_2e8 + 0x18))(local_2e8,in_stack_fffffffffffffcf8);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
      }
      if (local_1bc == 1) {
        ppvVar3 = (void **)(in_RDI + 0x218);
        local_120 = &local_208;
        local_118 = ppvVar3;
        local_110 = ppvVar3;
        if (ppvVar3 != local_120) {
          if (local_200 != (int *)0x0) {
            local_124 = 1;
            LOCK();
            local_128 = *local_200;
            *local_200 = *local_200 + 1;
            UNLOCK();
          }
          ppvVar5 = ppvVar3;
          local_100 = ppvVar3;
          if (*(long *)(in_RDI + 0x220) != 0) {
            piVar1 = *(int **)(in_RDI + 0x220);
            local_104 = 0xffffffff;
            LOCK();
            local_108 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_108 == 1) {
              if (*(long *)(in_RDI + 0x238) == 0) {
                local_8 = *ppvVar3;
                if (local_8 != (void *)0x0) {
                  free(local_8);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x238) + 0x18))
                          (*(long **)(in_RDI + 0x238),*ppvVar3);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
          *ppvVar5 = *local_120;
          ppvVar5[1] = local_120[1];
          ppvVar5[2] = local_120[2];
          *(undefined4 *)(ppvVar5 + 3) = *(undefined4 *)(local_120 + 3);
          ppvVar5[4] = local_120[4];
          *(undefined4 *)(ppvVar5 + 5) = *(undefined4 *)(local_120 + 5);
          *(undefined4 *)((long)ppvVar5 + 0x2c) = *(undefined4 *)((long)local_120 + 0x2c);
          *(undefined4 *)(ppvVar5 + 6) = *(undefined4 *)(local_120 + 6);
          *(undefined4 *)((long)ppvVar5 + 0x34) = *(undefined4 *)((long)local_120 + 0x34);
          *(undefined4 *)(ppvVar5 + 7) = *(undefined4 *)(local_120 + 7);
          ppvVar5[8] = local_120[8];
          local_110 = ppvVar5;
        }
      }
      if ((*local_1b0 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x170);
        local_60 = puVar4;
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_64 = 0xffffffff;
          LOCK();
          local_68 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_68 == 1) {
            if (*(long *)(in_RDI + 400) == 0) {
              local_58 = (void *)*puVar4;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        puVar4[2] = 0;
        *(undefined4 *)(puVar4 + 3) = 0;
        *(undefined4 *)(puVar4 + 5) = 0;
        *(undefined4 *)((long)puVar4 + 0x2c) = 0;
        *(undefined4 *)(puVar4 + 6) = 0;
        *(undefined4 *)((long)puVar4 + 0x34) = 0;
        *(undefined4 *)(puVar4 + 7) = 0;
        puVar4[8] = 0;
        puVar4[1] = 0;
      }
      local_19c = 0;
      ppvVar3 = &local_208;
      if (local_200 != (int *)0x0) {
        local_e4 = 0xffffffff;
        LOCK();
        local_e8 = *local_200;
        *local_200 = *local_200 + -1;
        UNLOCK();
        if (local_e8 == 1) {
          local_138 = ppvVar3;
          local_e0 = ppvVar3;
          if (local_1e8 == (long *)0x0) {
            local_18 = local_208;
            if (local_208 != (void *)0x0) {
              free(local_208);
            }
          }
          else {
            (**(code **)(*local_1e8 + 0x18))(local_1e8,local_208);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      ppvVar3[2] = (void *)0x0;
      *(undefined4 *)(ppvVar3 + 3) = 0;
      *(undefined4 *)(ppvVar3 + 5) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
      *(undefined4 *)(ppvVar3 + 6) = 0;
      *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
      *(undefined4 *)(ppvVar3 + 7) = 0;
      ppvVar3[8] = (void *)0x0;
      ppvVar3[1] = (void *)0x0;
    }
    else {
      create_group_ops(in_stack_00000058,in_stack_00000050);
      if ((*local_1b0 & 1) != 0) {
        puVar4 = (undefined8 *)(in_RDI + 0x170);
        if (*(long *)(in_RDI + 0x178) != 0) {
          piVar1 = *(int **)(in_RDI + 0x178);
          local_74 = 0xffffffff;
          LOCK();
          local_78 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_78 == 1) {
            local_70 = puVar4;
            if (*(long *)(in_RDI + 400) == 0) {
              local_50 = (void *)*puVar4;
              if (local_50 != (void *)0x0) {
                free(local_50);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*puVar4);
            }
          }
        }
        *puVar4 = 0;
        *(undefined8 *)(in_RDI + 0x180) = 0;
        *(undefined4 *)(in_RDI + 0x188) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x19c) = 0;
        *(undefined4 *)(in_RDI + 0x1a0) = 0;
        *(undefined4 *)(in_RDI + 0x1a4) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined8 *)(in_RDI + 0x1b0) = 0;
        *(undefined8 *)(in_RDI + 0x178) = 0;
      }
      local_19c = 0;
    }
  }
  else {
    local_19c = 0;
  }
  return local_19c;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}